

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall minibag::Player::Player(Player *this,PlayerOptions *options)

{
  size_type sVar1;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__s;
  allocator<char> *__a;
  NodeHandle private_node_handle;
  ServiceServer *in_stack_fffffffffffffdb8;
  ServiceServer *this_01;
  PlayerOptions *in_stack_fffffffffffffdf8;
  PlayerOptions *in_stack_fffffffffffffe00;
  undefined1 local_1b9 [33];
  ServiceServer local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  TimePublisher *in_stack_fffffffffffffe90;
  allocator<char> local_151;
  string local_150 [32];
  NodeHandle local_130 [24];
  Player *in_stack_fffffffffffffee8;
  offset_in_Player_to_subr in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff00;
  NodeHandle *in_stack_ffffffffffffff08;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  string local_30 [48];
  
  PlayerOptions::PlayerOptions(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::__cxx11::string::string(local_30);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1bb258);
  miniros::NodeHandle::NodeHandle((NodeHandle *)(in_RDI + 0xd0),local_30,(map *)&local_68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x1bb27b);
  std::__cxx11::string::~string(local_30);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x188);
  miniros::ServiceServer::ServiceServer((ServiceServer *)0x1bb29e);
  *(undefined1 *)(in_RDI + 0x198) = 0;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0xb8));
  *(bool *)(in_RDI + 0x19a) = sVar1 != 0;
  *(undefined1 *)(in_RDI + 0x19b) = 0;
  *(undefined1 *)(in_RDI + 0x19c) = 0;
  __s = (char *)(in_RDI + 0x1a0);
  miniros::Subscriber::Subscriber((Subscriber *)0x1bb2e6);
  miniros::Time::Time((Time *)0x1bb2f9);
  miniros::WallTime::WallTime((WallTime *)0x1bb30c);
  std::vector<std::shared_ptr<minibag::Bag>,_std::allocator<std::shared_ptr<minibag::Bag>_>_>::
  vector((vector<std::shared_ptr<minibag::Bag>,_std::allocator<std::shared_ptr<minibag::Bag>_>_> *)
         0x1bb324);
  __a = (allocator<char> *)(in_RDI + 0x1d8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>_>
         *)0x1bb33a);
  *(undefined1 *)(in_RDI + 0x208) = 0;
  TimeTranslator::TimeTranslator((TimeTranslator *)(in_RDI + 0x2d0));
  TimePublisher::TimePublisher(in_stack_fffffffffffffe90);
  miniros::Time::Time((Time *)0x1bb37d);
  miniros::Duration::Duration((Duration *)0x1bb395);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  local_178 = 0;
  local_188 = 0;
  uStack_180 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1bb3f1);
  miniros::NodeHandle::NodeHandle(local_130,local_150,(map *)&local_188);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x1bb41a);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  this_01 = (ServiceServer *)local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  miniros::NodeHandle::
  advertiseService<minibag::Player,std_srvs::SetBoolRequest_<std::allocator<void>>,std_srvs::SetBoolResponse_<std::allocator<void>>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  miniros::ServiceServer::operator=(this_01,in_stack_fffffffffffffdb8);
  miniros::ServiceServer::~ServiceServer(&local_198);
  std::__cxx11::string::~string((string *)(local_1b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b9);
  miniros::NodeHandle::~NodeHandle(local_130);
  return;
}

Assistant:

Player::Player(PlayerOptions const& options) :
    options_(options),
    paused_(false),
    // If we were given a list of topics to pause on, then go into that mode
    // by default (it can be toggled later via 't' from the keyboard).
    pause_for_topics_(options_.pause_topics.size() > 0),
    pause_change_requested_(false),
    requested_pause_state_(false),
    terminal_modified_(false)
{
  miniros::NodeHandle private_node_handle("~");
  pause_service_ = private_node_handle.advertiseService("pause_playback", &Player::pauseCallback, this);
}